

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O0

void __thiscall
duckdb::TemplatedValidityMask<unsigned_long>::SetInvalid
          (TemplatedValidityMask<unsigned_long> *this,idx_t row_idx)

{
  long *in_RDI;
  TemplatedValidityMask<unsigned_long> *unaff_retaddr;
  
  if (*in_RDI == 0) {
    Initialize(unaff_retaddr,(idx_t)in_RDI);
  }
  SetInvalidUnsafe(unaff_retaddr,(idx_t)in_RDI);
  return;
}

Assistant:

inline void SetInvalid(idx_t row_idx) {
#ifdef DEBUG
		if (row_idx >= capacity) {
			throw InternalException("ValidityMask::SetInvalid - row_idx %d is out-of-range for mask with capacity %llu",
			                        row_idx, capacity);
		}
#endif
		if (!validity_mask) {
			Initialize(capacity);
		}
		SetInvalidUnsafe(row_idx);
	}